

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

bool rr::LineRasterUtil::doesLineSegmentExitDiamond
               (SubpixelLineSegment *line,Vector<long,_2> *diamondCenter)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int i;
  LINE_SIDE LVar6;
  LINE_SIDE LVar7;
  long lVar8;
  int i_29;
  ulong uVar9;
  uint uVar10;
  long sqSum;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  Vector<long,_2> *pVVar14;
  Vector<long,_2> *pVVar15;
  long *v;
  bool bVar16;
  Vector<long,_2> p;
  Vector<long,_2> v_1;
  Vector<long,_2> u1;
  Vector<long,_2> res_8;
  Vector<long,_2> u2;
  DiamondBound bounds [4];
  DiamondCorners corners [4];
  Vector<long,_2> local_218;
  SubpixelLineSegment local_208;
  SubpixelLineSegment local_1e8;
  Vector<long,_2> *local_1c0;
  long local_1b8 [4];
  Vector<long,_2> *local_198;
  ulong local_190;
  long local_188;
  long local_180;
  long local_178 [8];
  undefined1 local_138;
  long local_130 [4];
  undefined1 local_110;
  long local_108 [4];
  undefined1 local_e8;
  long local_e0 [4];
  undefined1 local_c0;
  Vector<long,_2> local_b8;
  undefined1 local_a8;
  undefined8 local_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined8 local_84;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined8 local_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  pVVar15 = &line->m_v1;
  local_178[4] = 0;
  local_178[5] = 0;
  lVar8 = 0;
  do {
    local_178[lVar8 + 4] = (line->m_v1).m_data[lVar8] - (line->m_v0).m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  local_b8.m_data[0] = 0;
  local_b8.m_data[1] = 0;
  lVar8 = 0;
  do {
    local_b8.m_data[lVar8] = diamondCenter->m_data[lVar8] - (line->m_v0).m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  lVar8 = local_b8.m_data[1] * local_178[4] - local_b8.m_data[0] * local_178[5];
  uVar9 = lVar8 - 0xb504f334;
  lVar12 = 0;
  uVar11 = 0;
  do {
    uVar11 = uVar11 + local_178[lVar12 + 4] * local_178[lVar12 + 4];
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  lVar8 = lVar8 * lVar8;
  if (uVar9 < 0xfffffffe95f61999) {
    lVar8 = 0;
  }
  bVar16 = uVar11 >> 0x20 == 0;
  if (bVar16) {
    uVar10 = (uint)uVar11;
    if (uVar10 == 0) {
      uVar13 = 0x20;
    }
    else {
      uVar13 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = uVar13 ^ 0x1f;
    }
    uVar13 = uVar13 + 0x20;
  }
  else if (bVar16) {
    uVar13 = 0x20;
  }
  else {
    uVar13 = 0x1f;
    uVar10 = (uint)(uVar11 >> 0x20);
    if (uVar10 != 0) {
      for (; uVar10 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = uVar13 ^ 0x1f;
  }
  if (((int)uVar13 < 0x12) || (0xfffffffe95f61998 < uVar9)) {
    lVar12 = 0;
    if (0x11 < (int)uVar13) {
      lVar12 = uVar11 * 0x10000;
    }
    if (((uVar9 < 0xfffffffe95f61999) || ((int)uVar13 < 0x12)) || (lVar8 <= lVar12)) {
      local_b8.m_data[0] = 0;
      local_b8.m_data[1] = -0x80;
      local_178[4] = 0;
      local_178[5] = 0;
      lVar8 = 0;
      do {
        local_178[lVar8 + 4] = local_b8.m_data[lVar8] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_208.m_v0.m_data[0] = -0x80;
      local_208.m_v0.m_data[1] = 0;
      local_178[6] = 0;
      local_178[7] = 0;
      lVar8 = 0;
      do {
        local_178[lVar8 + 6] = local_208.m_v0.m_data[lVar8] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_138 = 0;
      local_1e8.m_v0.m_data[0] = -0x80;
      local_1e8.m_v0.m_data[1] = 0;
      local_130[0] = 0;
      local_130[1] = 0;
      lVar8 = 0;
      do {
        local_130[lVar8] = local_1e8.m_v0.m_data[lVar8] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_1b8[2] = 0;
      local_1b8[3] = 0x80;
      local_130[2] = 0;
      local_130[3] = 0;
      lVar8 = 0;
      do {
        local_130[lVar8 + 2] = local_1b8[lVar8 + 2] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_110 = 0;
      local_1b8[0] = 0;
      local_1b8[1] = 0x80;
      local_108[0] = 0;
      local_108[1] = 0;
      lVar8 = 0;
      do {
        local_108[lVar8] = local_1b8[lVar8] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_218.m_data[0] = 0x80;
      local_218.m_data[1] = 0;
      local_108[2] = 0;
      local_108[3] = 0;
      lVar8 = 0;
      do {
        local_108[lVar8 + 2] = local_218.m_data[lVar8] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_e8 = 1;
      local_178[2] = 0x80;
      local_178[3] = 0;
      local_e0[0] = 0;
      local_e0[1] = 0;
      lVar8 = 0;
      do {
        local_e0[lVar8] = local_178[lVar8 + 2] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_178[0] = 0;
      local_178[1] = 0xffffffffffffff80;
      local_e0[2] = 0;
      local_e0[3] = 0;
      lVar8 = 0;
      do {
        local_e0[lVar8 + 2] = local_178[lVar8] + diamondCenter->m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      local_c0 = 1;
      uVar9 = 0;
      pVVar14 = &local_b8;
      local_b8.m_data[0] = 0;
      local_b8.m_data[1] = -0x80;
      local_a8 = 0;
      local_a4 = 0x200000003;
      local_9c = 3;
      local_98 = 0xffffffffffffff80;
      local_90 = 0;
      local_88 = 0;
      local_84 = 0;
      local_7c = 1;
      local_78 = 0;
      local_70 = 0x80;
      local_68 = 0;
      local_64 = 0x300000002;
      local_5c = 2;
      local_58 = 0x80;
      local_50 = 0;
      local_48 = 1;
      local_44 = 0x100000001;
      local_3c = 0;
      local_190 = 0;
      local_198 = pVVar15;
      bVar16 = false;
      do {
        local_1c0 = &local_b8 + uVar9 * 2;
        local_218.m_data[0] = 0;
        local_218.m_data[1] = 0;
        lVar8 = 0;
        do {
          local_218.m_data[lVar8] = pVVar14->m_data[lVar8] + diamondCenter->m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 == 1);
        bVar2 = vertexOnLine(&local_218,line);
        bVar4 = false;
        bVar3 = bVar16;
        if (bVar2) {
          local_208.m_v0.m_data[0] = 0;
          local_208.m_v0.m_data[1] = 0;
          lVar8 = 0;
          do {
            local_208.m_v0.m_data[lVar8] = (line->m_v1).m_data[lVar8] - (line->m_v0).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          local_1e8.m_v0.m_data[0] = 0;
          local_1e8.m_v0.m_data[1] = 0;
          lVar8 = 0;
          do {
            local_1e8.m_v0.m_data[lVar8] = local_218.m_data[lVar8] - (line->m_v0).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          local_1b8[2] = 0;
          local_1b8[3] = 0;
          lVar8 = 0;
          do {
            local_1b8[lVar8 + 2] = local_218.m_data[lVar8] - (line->m_v1).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          if (local_208.m_v0.m_data[1] != 0 || local_208.m_v0.m_data[0] != 0) {
            lVar12 = 0;
            lVar8 = 0;
            do {
              lVar8 = lVar8 + local_1e8.m_v0.m_data[lVar12] * local_208.m_v0.m_data[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 == 1);
            if (-1 < lVar8) {
              local_1b8[0] = 0;
              local_1b8[1] = 0;
              lVar8 = 0;
              do {
                local_1b8[lVar8] = -local_208.m_v0.m_data[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 == 1);
              lVar12 = 0;
              lVar8 = 0;
              do {
                lVar8 = lVar8 + local_1b8[lVar12 + 2] * local_1b8[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 == 1);
              if (-1 < lVar8) {
                lVar8 = (line->m_v0).m_data[0];
                if (((local_218.m_data[0] != lVar8) ||
                    (local_218.m_data[1] != (line->m_v0).m_data[1])) &&
                   ((local_218.m_data[0] != pVVar15->m_data[0] ||
                    (local_218.m_data[1] != (line->m_v1).m_data[1])))) {
                  iVar1 = *(int *)((long)local_1c0[1].m_data + 4);
                  bVar3 = true;
                  bVar4 = true;
                  if (iVar1 == 1) goto LAB_005ac8dd;
                  if (iVar1 == 2) {
                    local_208.m_v0.m_data[0] = 0;
                    local_208.m_v0.m_data[1] = 0;
                    lVar12 = 0;
                    do {
                      local_208.m_v0.m_data[lVar12] =
                           pVVar15->m_data[lVar12] -
                           (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 == 1);
                    local_1e8.m_v0.m_data[0] = 0;
                    local_1e8.m_v0.m_data[1] = 0;
                    lVar12 = 0;
                    do {
                      local_1e8.m_v0.m_data[lVar12] =
                           pVVar15->m_data[lVar12] -
                           (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 == 1);
                    if (local_208.m_v0.m_data[0] * local_1e8.m_v0.m_data[1] < 1) goto LAB_005ac8dd;
                  }
                  if (iVar1 == 3) {
                    local_208.m_v0.m_data[0] = 0;
                    local_208.m_v0.m_data[1] = 0;
                    lVar12 = 0;
                    do {
                      local_208.m_v0.m_data[lVar12] =
                           pVVar15->m_data[lVar12] -
                           (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 == 1);
                    local_1e8.m_v0.m_data[0] = 0;
                    local_1e8.m_v0.m_data[1] = 0;
                    lVar12 = 0;
                    do {
                      local_1e8.m_v0.m_data[lVar12] =
                           pVVar15->m_data[lVar12] -
                           (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar12];
                      lVar12 = lVar12 + 1;
                    } while (lVar12 == 1);
                    if (0 < local_208.m_v0.m_data[0] * local_1e8.m_v0.m_data[1]) goto LAB_005ac8dd;
                  }
                }
                local_180 = local_218.m_data[0];
                local_188 = lVar8;
                bVar3 = lineInCornerAngleRange(line,local_1c0);
                if (bVar3) {
                  bVar3 = false;
                  cVar5 = (char)local_1c0[1].m_data[0];
                  if ((local_180 == local_188) && (cVar5 == '\0')) {
                    bVar4 = false;
                    do {
                      bVar3 = bVar4;
                      if (bVar3) break;
                      bVar4 = true;
                    } while (local_218.m_data[1] == (line->m_v0).m_data[1]);
                  }
                  bVar4 = false;
                  if ((cVar5 != '\0') && (local_180 == pVVar15->m_data[0])) {
                    bVar2 = false;
                    do {
                      bVar4 = bVar2;
                      if (bVar4) break;
                      bVar2 = true;
                    } while (local_218.m_data[1] == (line->m_v1).m_data[1]);
                  }
                  bVar2 = (bool)((bVar3 | bVar4) ^ 1);
                  bVar16 = (bool)(bVar16 | bVar2);
                  bVar4 = true;
                  bVar3 = bVar16;
                  if (bVar2) goto LAB_005ac8dd;
                }
                if (local_218.m_data[0] == pVVar15->m_data[0]) {
                  bVar3 = true;
                  do {
                    bVar4 = bVar3;
                    if (!bVar4) goto LAB_005ac987;
                    bVar3 = false;
                  } while (local_218.m_data[1] == (line->m_v1).m_data[1]);
                  if (bVar4) goto LAB_005aca41;
LAB_005ac987:
                  iVar1 = *(int *)((long)local_1c0[1].m_data + 0xc);
                  if ((2 < iVar1 - 1U) ||
                     (bVar3 = lineInCornerAngleRange(line,local_1c0), pVVar15 = local_198, !bVar3))
                  {
                    if (iVar1 == 2) {
                      local_208.m_v0.m_data[0] = 0;
                      local_208.m_v0.m_data[1] = 0;
                      lVar8 = 0;
                      do {
                        local_208.m_v0.m_data[lVar8] =
                             pVVar15->m_data[lVar8] -
                             (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                        lVar8 = lVar8 + 1;
                      } while (lVar8 == 1);
                      if (local_208.m_v0.m_data[0] < 0) {
                        local_1e8.m_v0.m_data[0] = 0;
                        local_1e8.m_v0.m_data[1] = 0;
                        lVar8 = 0;
                        do {
                          local_1e8.m_v0.m_data[lVar8] =
                               pVVar15->m_data[lVar8] -
                               (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                          lVar8 = lVar8 + 1;
                        } while (lVar8 == 1);
                        if (0 < local_1e8.m_v0.m_data[1]) goto LAB_005acc12;
                      }
                    }
                    if (iVar1 == 3) {
                      local_208.m_v0.m_data[0] = 0;
                      local_208.m_v0.m_data[1] = 0;
                      lVar8 = 0;
                      do {
                        local_208.m_v0.m_data[lVar8] =
                             pVVar15->m_data[lVar8] -
                             (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                        lVar8 = lVar8 + 1;
                      } while (lVar8 == 1);
                      if (0 < local_208.m_v0.m_data[0]) {
                        local_1e8.m_v0.m_data[0] = 0;
                        local_1e8.m_v0.m_data[1] = 0;
                        lVar8 = 0;
                        do {
                          local_1e8.m_v0.m_data[lVar8] =
                               pVVar15->m_data[lVar8] -
                               (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                          lVar8 = lVar8 + 1;
                        } while (lVar8 == 1);
                        if (0 < local_1e8.m_v0.m_data[1]) goto LAB_005acc12;
                      }
                    }
                    goto LAB_005aca41;
                  }
LAB_005acc12:
                  bVar4 = true;
                  bVar3 = true;
                }
                else {
LAB_005aca41:
                  if (local_218.m_data[0] == (line->m_v0).m_data[0]) {
                    bVar3 = true;
                    do {
                      bVar4 = bVar3;
                      if (!bVar4) goto LAB_005aca72;
                      bVar3 = false;
                    } while (local_218.m_data[1] == (line->m_v0).m_data[1]);
                    if (!bVar4) {
LAB_005aca72:
                      iVar1 = (int)local_1c0[1].m_data[1];
                      if ((iVar1 == 1) &&
                         (bVar3 = lineInCornerOutsideAngleRange(line,local_1c0), pVVar15 = local_198
                         , bVar3)) goto LAB_005acc12;
                      if (iVar1 == 2) {
                        local_208.m_v0.m_data[0] = 0;
                        local_208.m_v0.m_data[1] = 0;
                        lVar8 = 0;
                        do {
                          local_208.m_v0.m_data[lVar8] =
                               pVVar15->m_data[lVar8] -
                               (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                          lVar8 = lVar8 + 1;
                        } while (lVar8 == 1);
                        if (0 < local_208.m_v0.m_data[0]) {
                          local_1e8.m_v0.m_data[0] = 0;
                          local_1e8.m_v0.m_data[1] = 0;
                          lVar8 = 0;
                          do {
                            local_1e8.m_v0.m_data[lVar8] =
                                 pVVar15->m_data[lVar8] -
                                 (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                            lVar8 = lVar8 + 1;
                          } while (lVar8 == 1);
                          if (0 < local_1e8.m_v0.m_data[1]) {
                            local_1b8[2] = 0;
                            local_1b8[3] = 0;
                            lVar8 = 0;
                            do {
                              local_1b8[lVar8 + 2] =
                                   pVVar15->m_data[lVar8] -
                                   (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                              lVar8 = lVar8 + 1;
                            } while (lVar8 == 1);
                            local_1b8[0] = 0;
                            local_1b8[1] = 0;
                            lVar8 = 0;
                            do {
                              local_1b8[lVar8] =
                                   pVVar15->m_data[lVar8] -
                                   (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                              lVar8 = lVar8 + 1;
                            } while (lVar8 == 1);
                            if (local_1b8[3] <= local_1b8[0]) goto LAB_005acc12;
                          }
                        }
                      }
                      if (iVar1 == 3) {
                        local_208.m_v0.m_data[0] = 0;
                        local_208.m_v0.m_data[1] = 0;
                        lVar8 = 0;
                        do {
                          local_208.m_v0.m_data[lVar8] =
                               pVVar15->m_data[lVar8] -
                               (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                          lVar8 = lVar8 + 1;
                        } while (lVar8 == 1);
                        if (0 < local_208.m_v0.m_data[0]) {
                          local_1e8.m_v0.m_data[0] = 0;
                          local_1e8.m_v0.m_data[1] = 0;
                          lVar8 = 0;
                          do {
                            local_1e8.m_v0.m_data[lVar8] =
                                 pVVar15->m_data[lVar8] -
                                 (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                            lVar8 = lVar8 + 1;
                          } while (lVar8 == 1);
                          if (local_1e8.m_v0.m_data[1] < 1) {
                            local_1b8[2] = 0;
                            local_1b8[3] = 0;
                            lVar8 = 0;
                            do {
                              local_1b8[lVar8 + 2] =
                                   pVVar15->m_data[lVar8] -
                                   (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                              lVar8 = lVar8 + 1;
                            } while (lVar8 == 1);
                            local_1b8[0] = 0;
                            local_1b8[1] = 0;
                            lVar8 = 0;
                            do {
                              local_1b8[lVar8] =
                                   pVVar15->m_data[lVar8] -
                                   (((SubpixelLineSegment *)(pVVar15 + -1))->m_v0).m_data[lVar8];
                              lVar8 = lVar8 + 1;
                            } while (lVar8 == 1);
                            if (SBORROW8(local_1b8[0],-local_1b8[3]) ==
                                local_1b8[0] + local_1b8[3] < 0) goto LAB_005acc12;
                          }
                        }
                      }
                    }
                  }
                  bVar4 = false;
                  bVar3 = bVar16;
                }
              }
            }
          }
        }
LAB_005ac8dd:
        if (bVar4) break;
        bVar16 = 2 < uVar9;
        uVar9 = uVar9 + 1;
        local_190 = (ulong)bVar16;
        pVVar14 = pVVar14 + 2;
        bVar16 = bVar3;
      } while (uVar9 != 4);
      if ((local_190 & 1) == 0) {
        return bVar3;
      }
      lVar8 = 4;
      v = local_178 + 6;
      do {
        pVVar15 = (Vector<long,_2> *)(v + -2);
        local_208.m_v0.m_data[0] = ((Vector<long,_2> *)(v + -2))->m_data[0];
        local_208.m_v0.m_data[1] = v[-1];
        local_208.m_v1.m_data[0] = *v;
        local_208.m_v1.m_data[1] = v[1];
        bVar16 = vertexOnLeftSideOfLine(&line->m_v0,&local_208);
        if (bVar16) {
          bVar16 = false;
        }
        else {
          bVar16 = true;
          if ((char)((Vector<long,_2> *)(v + 2))->m_data[0] == '\x01') {
            local_1e8.m_v0.m_data[0] = pVVar15->m_data[0];
            local_1e8.m_v0.m_data[1] = v[-1];
            local_1e8.m_v1.m_data[0] = *v;
            local_1e8.m_v1.m_data[1] = v[1];
            bVar16 = vertexOnLine(&line->m_v0,&local_1e8);
            bVar16 = !bVar16;
          }
        }
        local_208.m_v0.m_data[0] = pVVar15->m_data[0];
        local_208.m_v0.m_data[1] = v[-1];
        local_208.m_v1.m_data[0] = *v;
        local_208.m_v1.m_data[1] = v[1];
        bVar4 = vertexOnLeftSideOfLine(local_198,&local_208);
        bVar2 = true;
        if (!bVar4) {
          if ((char)((Vector<long,_2> *)(v + 2))->m_data[0] == '\x01') {
            local_1e8.m_v0.m_data[0] = pVVar15->m_data[0];
            local_1e8.m_v0.m_data[1] = v[-1];
            local_1e8.m_v1.m_data[0] = *v;
            local_1e8.m_v1.m_data[1] = v[1];
            bVar2 = vertexOnLine(local_198,&local_1e8);
          }
          else {
            bVar2 = false;
          }
        }
        cVar5 = '\a';
        if (!bVar16 && bVar2 == false) {
          LVar6 = getVertexSide(pVVar15,line);
          LVar7 = getVertexSide((Vector<long,_2> *)v,line);
          cVar5 = LVar6 != LVar7 && (LVar7 != LINE_SIDE_INTERSECT && LVar6 != LINE_SIDE_INTERSECT);
          bVar3 = (bool)(bVar3 | cVar5);
        }
        if ((cVar5 != '\a') && (cVar5 != '\0')) {
          return bVar3;
        }
        v = v + 5;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
  }
  return false;
}

Assistant:

bool doesLineSegmentExitDiamond (const SubpixelLineSegment& line, const tcu::Vector<deInt64,2>& diamondCenter)
{
	DE_ASSERT(isTheCenterOfTheFragment(diamondCenter));

	// Diamond Center is at diamondCenter in subpixel coords

	const deInt64 halfPixel = 1ll << (RASTERIZER_SUBPIXEL_BITS-1);

	// Reject distant diamonds early
	{
		const tcu::Vector<deInt64,2>	u				= line.direction();
		const tcu::Vector<deInt64,2>	v				= (diamondCenter - line.m_v0);
		const deInt64					crossProduct	= (u.x() * v.y() - u.y() * v.x());

		// crossProduct = |p| |l| sin(theta)
		// distanceFromLine = |p| sin(theta)
		// => distanceFromLine = crossProduct / |l|
		//
		// |distanceFromLine| > C
		// => distanceFromLine^2 > C^2
		// => crossProduct^2 / |l|^2 > C^2
		// => crossProduct^2 > |l|^2 * C^2

		const deInt64	floorSqrtMaxInt64			= 3037000499LL; //!< floor(sqrt(MAX_INT64))

		const deInt64	broadRejectDistance			= 2 * halfPixel;
		const deInt64	broadRejectDistanceSquared	= broadRejectDistance * broadRejectDistance;
		const bool		crossProductOverflows		= (crossProduct > floorSqrtMaxInt64 || crossProduct < -floorSqrtMaxInt64);
		const deInt64	crossProductSquared			= (crossProductOverflows) ? (0) : (crossProduct * crossProduct); // avoid overflow
		const deInt64	lineLengthSquared			= tcu::lengthSquared(u);
		const bool		limitValueCouldOverflow		= ((64 - deClz64(lineLengthSquared)) + (64 - deClz64(broadRejectDistanceSquared))) > 63;
		const deInt64	limitValue					= (limitValueCouldOverflow) ? (0) : (lineLengthSquared * broadRejectDistanceSquared); // avoid overflow

		// only cross overflows
		if (crossProductOverflows && !limitValueCouldOverflow)
			return false;

		// both representable
		if (!crossProductOverflows && !limitValueCouldOverflow)
		{
			if (crossProductSquared > limitValue)
				return false;
		}
	}

	const struct DiamondBound
	{
		tcu::Vector<deInt64,2>	p0;
		tcu::Vector<deInt64,2>	p1;
		bool					edgeInclusive; // would a point on the bound be inside of the region
	} bounds[] =
	{
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				-halfPixel),	diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				diamondCenter + tcu::Vector<deInt64,2>(0,			halfPixel),		 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				halfPixel),		diamondCenter + tcu::Vector<deInt64,2>(halfPixel,	0),				 true	},
		{ diamondCenter + tcu::Vector<deInt64,2>(halfPixel,		0),				diamondCenter + tcu::Vector<deInt64,2>(0,			-halfPixel),	 true	},
	};

	const struct DiamondCorners
	{
		enum CORNER_EDGE_CASE_BEHAVIOR
		{
			CORNER_EDGE_CASE_NONE,							// if the line intersects just a corner, no entering or exiting
			CORNER_EDGE_CASE_HIT,							// if the line intersects just a corner, entering and exit
			CORNER_EDGE_CASE_HIT_FIRST_QUARTER,				// if the line intersects just a corner and the line has either endpoint in (+X,-Y) direction (preturbing moves the line inside)
			CORNER_EDGE_CASE_HIT_SECOND_QUARTER				// if the line intersects just a corner and the line has either endpoint in (+X,+Y) direction (preturbing moves the line inside)
		};
		enum CORNER_START_CASE_BEHAVIOR
		{
			CORNER_START_CASE_NONE,							// the line starting point is outside, no exiting
			CORNER_START_CASE_OUTSIDE,						// exit, if line does not intersect the region (preturbing moves the start point inside)
			CORNER_START_CASE_POSITIVE_Y_45,				// exit, if line the angle of line vector and X-axis is in range (0, 45] in positive Y side.
			CORNER_START_CASE_NEGATIVE_Y_45					// exit, if line the angle of line vector and X-axis is in range [0, 45] in negative Y side.
		};
		enum CORNER_END_CASE_BEHAVIOR
		{
			CORNER_END_CASE_NONE,							// end is inside, no exiting (preturbing moves the line end inside)
			CORNER_END_CASE_DIRECTION,						// exit, if line intersected the region (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER,	// exit, if line intersected the region, or line originates from (+X,-Y) direction (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER	// exit, if line intersected the region, or line originates from (+X,+Y) direction (preturbing moves the line end outside)
		};

		tcu::Vector<deInt64,2>		dp;
		bool						pointInclusive;			// would a point in this corner intersect with the region
		CORNER_EDGE_CASE_BEHAVIOR	lineBehavior;			// would a line segment going through this corner intersect with the region
		CORNER_START_CASE_BEHAVIOR	startBehavior;			// how the corner behaves if the start point at the corner
		CORNER_END_CASE_BEHAVIOR	endBehavior;			// how the corner behaves if the end point at the corner
	} corners[] =
	{
		{ tcu::Vector<deInt64,2>(0,				-halfPixel),	false,	DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER,	DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER},
		{ tcu::Vector<deInt64,2>(-halfPixel,	0),				false,	DiamondCorners::CORNER_EDGE_CASE_NONE,					DiamondCorners::CORNER_START_CASE_NONE,				DiamondCorners::CORNER_END_CASE_DIRECTION					},
		{ tcu::Vector<deInt64,2>(0,				halfPixel),		false,	DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER,		DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER	},
		{ tcu::Vector<deInt64,2>(halfPixel,		0),				true,	DiamondCorners::CORNER_EDGE_CASE_HIT,					DiamondCorners::CORNER_START_CASE_OUTSIDE,			DiamondCorners::CORNER_END_CASE_NONE						},
	};

	// Corner cases at the corners
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(corners); ++ndx)
	{
		const tcu::Vector<deInt64,2> p	= diamondCenter + corners[ndx].dp;
		const bool intersectsAtCorner	= LineRasterUtil::vertexOnLineSegment(p, line);

		if (!intersectsAtCorner)
			continue;

		// line segment body intersects with the corner
		if (p != line.m_v0 && p != line.m_v1)
		{
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT)
				return true;

			// endpoint in (+X, -Y) (X or Y may be 0) direction <==> x*y <= 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER &&
				(line.direction().x() * line.direction().y()) <= 0)
				return true;

			// endpoint in (+X, +Y) (Y > 0) direction <==> x*y > 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER &&
				(line.direction().x() * line.direction().y()) > 0)
				return true;
		}

		// line exits the area at the corner
		if (lineInCornerAngleRange(line, corners[ndx].dp))
		{
			const bool startIsInside = corners[ndx].pointInclusive || p != line.m_v0;
			const bool endIsOutside = !corners[ndx].pointInclusive || p != line.m_v1;

			// starting point is inside the region and end endpoint is outside
			if (startIsInside && endIsOutside)
				return true;
		}

		// line end is at the corner
		if (p == line.m_v1)
		{
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER)
			{
				// did the line intersect the region
				if (lineInCornerAngleRange(line, corners[ndx].dp))
					return true;
			}

			// due to the perturbed endpoint, lines at this the angle will cause and enter-exit pair
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER &&
				line.direction().x() < 0 &&
				line.direction().y() > 0)
				return true;
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER &&
				line.direction().x() > 0 &&
				line.direction().y() > 0)
				return true;
		}

		// line start is at the corner
		if (p == line.m_v0)
		{
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_OUTSIDE)
			{
				// if the line is not going inside, it will exit
				if (lineInCornerOutsideAngleRange(line, corners[ndx].dp))
					return true;
			}

			// exit, if line the angle between line vector and X-axis is in range (0, 45] in positive Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45 &&
				line.direction().x() > 0 &&
				line.direction().y() > 0 &&
				line.direction().y() <= line.direction().x())
				return true;

			// exit, if line the angle between line vector and X-axis is in range [0, 45] in negative Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45 &&
				 line.direction().x() > 0 &&
				 line.direction().y() <= 0 &&
				-line.direction().y() <= line.direction().x())
				return true;
		}
	}

	// Does the line intersect boundary at the left == exits the diamond
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bounds); ++ndx)
	{
		const bool startVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));
		const bool endVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));

		// start must be on inside this half space (left or at the inclusive boundary)
		if (!startVertexInside)
			continue;

		// end must be outside of this half-space (right or at non-inclusive boundary)
		if (endVertexInside)
			continue;

		// Does the line via v0 and v1 intersect the line segment p0-p1
		// <==> p0 and p1 are the different sides (LEFT, RIGHT) of the v0-v1 line.
		// Corners are not allowed, they are checked already
		LineRasterUtil::LINE_SIDE sideP0 = LineRasterUtil::getVertexSide(bounds[ndx].p0, line);
		LineRasterUtil::LINE_SIDE sideP1 = LineRasterUtil::getVertexSide(bounds[ndx].p1, line);

		if (sideP0 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP1 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP0 != sideP1)
			return true;
	}

	return false;
}